

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

bool __thiscall HighsSparseMatrix::operator==(HighsSparseMatrix *this,HighsSparseMatrix *matrix)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  MatrixFormat MVar5;
  MatrixFormat MVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  double *pdVar10;
  undefined1 auVar11 [16];
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double *pdVar15;
  size_t __n;
  double *pdVar16;
  bool bVar17;
  bool bVar18;
  
  MVar5 = this->format_;
  MVar6 = matrix->format_;
  uVar1 = this->num_col_;
  uVar3 = this->num_row_;
  uVar2 = matrix->num_col_;
  uVar4 = matrix->num_row_;
  piVar7 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar8 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)piVar7 - (long)piVar8;
  piVar9 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (__n == (long)(matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar9) {
    if (piVar7 == piVar8) {
      bVar17 = true;
    }
    else {
      iVar12 = bcmp(piVar8,piVar9,__n);
      bVar17 = iVar12 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  piVar7 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar9 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)piVar8 - (long)piVar7 ==
      (long)(matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)piVar9) {
    if (piVar8 == piVar7) {
      uVar13 = (undefined4)CONCAT71((int7)((ulong)piVar8 >> 8),1);
    }
    else {
      iVar12 = bcmp(piVar7,piVar9,(long)piVar8 - (long)piVar7);
      uVar13 = CONCAT31((int3)((uint)iVar12 >> 8),iVar12 == 0);
    }
  }
  else {
    uVar13 = 0;
  }
  pdVar15 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar10 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar16 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar10 - (long)pdVar15 ==
      (long)(matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar16) {
    bVar18 = pdVar15 == pdVar10;
    if (bVar18) goto LAB_003802ed;
    if ((*pdVar15 == *pdVar16) && (!NAN(*pdVar15) && !NAN(*pdVar16))) {
      do {
        pdVar16 = pdVar16 + 1;
        pdVar15 = pdVar15 + 1;
        bVar18 = pdVar15 == pdVar10;
        if (bVar18) goto LAB_003802ed;
      } while ((*pdVar15 == *pdVar16) && (!NAN(*pdVar15) && !NAN(*pdVar16)));
    }
  }
  bVar18 = false;
LAB_003802ed:
  auVar11._4_4_ = -(uint)(uVar1 == uVar2);
  auVar11._0_4_ = -(uint)(uVar1 == uVar2);
  auVar11._8_4_ = -(uint)(uVar3 == uVar4);
  auVar11._12_4_ = -(uint)(uVar3 == uVar4);
  uVar14 = movmskpd(uVar13,auVar11);
  return (bool)(bVar17 & (byte)uVar13 & bVar18 & (byte)uVar14 & (byte)uVar14 >> 1 & MVar5 == MVar6);
}

Assistant:

bool HighsSparseMatrix::operator==(const HighsSparseMatrix& matrix) const {
  bool equal = true;
  equal = this->format_ == matrix.format_ && equal;
  equal = this->num_col_ == matrix.num_col_ && equal;
  equal = this->num_row_ == matrix.num_row_ && equal;
  equal = this->start_ == matrix.start_ && equal;
  equal = this->index_ == matrix.index_ && equal;
  equal = this->value_ == matrix.value_ && equal;
  return equal;
}